

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  undefined1 (*pauVar1) [16];
  uint *puVar2;
  fpclass_type fVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  cpp_dec_float<100U,_int,_void> *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  uint local_a8 [3];
  undefined3 uStack_9b;
  int iStack_98;
  bool bStack_94;
  undefined8 local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_88,0.0);
  iVar10 = (*(this->
             super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SLinSolver[4])(this);
  local_38 = __return_storage_ptr__;
  if (iVar10 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_88,1.0);
      iVar10 = (*(this->
                 super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SLinSolver[4])(this);
      if (0 < iVar10) {
        lVar11 = 0;
        lVar12 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&local_88,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar11));
          lVar12 = lVar12 + 1;
          iVar10 = (*(this->
                     super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SLinSolver[4])(this);
          lVar11 = lVar11 + 0x50;
        } while (lVar12 < iVar10);
      }
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 0x10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems[6] = 0;
      local_178.data._M_elems[7] = 0;
      local_178.data._M_elems[8] = 0;
      local_178.data._M_elems[9] = 0;
      local_178.data._M_elems[10] = 0;
      local_178.data._M_elems[0xb] = 0;
      local_178.data._M_elems[0xc] = 0;
      local_178.data._M_elems[0xd] = 0;
      local_178.data._M_elems[0xe] = 0;
      local_178.data._M_elems[0xf] = 0;
      local_178.exp = 0;
      local_178.neg = false;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x10;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems._56_5_ = 0;
      local_128.data._M_elems[0xf]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_128,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_178,&local_128,&local_88);
      local_88.data._M_elems[0] = local_178.data._M_elems[0];
      local_88.data._M_elems[1] = local_178.data._M_elems[1];
      local_88.data._M_elems[2] = local_178.data._M_elems[2];
      local_88.data._M_elems[3] = local_178.data._M_elems[3];
      local_88.data._M_elems[4] = local_178.data._M_elems[4];
      local_88.data._M_elems[5] = local_178.data._M_elems[5];
      local_88.data._M_elems[6] = local_178.data._M_elems[6];
      local_88.data._M_elems[7] = local_178.data._M_elems[7];
      local_88.data._M_elems[8] = local_178.data._M_elems[8];
      local_88.data._M_elems[9] = local_178.data._M_elems[9];
      local_88.data._M_elems[10] = local_178.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_178.data._M_elems[0xb];
      local_88.data._M_elems[0xc] = local_178.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_178.data._M_elems[0xd];
      local_88.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_178.data._M_elems[0xf],local_178.data._M_elems[0xe]),0);
      local_88.data._M_elems[0xf]._1_3_ = (undefined3)(local_178.data._M_elems[0xf] >> 8);
      local_88.exp = local_178.exp;
      local_88.neg = local_178.neg;
      local_88.fpclass = local_178.fpclass;
      local_88.prec_elem = local_178.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_88,0.0);
      iVar10 = (*(this->
                 super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SLinSolver[4])(this);
      if (0 < iVar10) {
        lVar12 = 0;
        lVar11 = 0;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 0x10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems[6] = 0;
          local_178.data._M_elems[7] = 0;
          local_178.data._M_elems[8] = 0;
          local_178.data._M_elems[9] = 0;
          local_178.data._M_elems[10] = 0;
          local_178.data._M_elems[0xb] = 0;
          local_178.data._M_elems[0xc] = 0;
          local_178.data._M_elems[0xd] = 0;
          local_178.data._M_elems[0xe] = 0;
          local_178.data._M_elems[0xf] = 0;
          local_178.exp = 0;
          local_178.neg = false;
          local_128.fpclass = cpp_dec_float_finite;
          local_128.prec_elem = 0x10;
          local_128.data._M_elems[0] = 0;
          local_128.data._M_elems[1] = 0;
          local_128.data._M_elems[2] = 0;
          local_128.data._M_elems[3] = 0;
          local_128.data._M_elems[4] = 0;
          local_128.data._M_elems[5] = 0;
          local_128.data._M_elems[6] = 0;
          local_128.data._M_elems[7] = 0;
          local_128.data._M_elems[8] = 0;
          local_128.data._M_elems[9] = 0;
          local_128.data._M_elems[10] = 0;
          local_128.data._M_elems[0xb] = 0;
          local_128.data._M_elems[0xc] = 0;
          local_128.data._M_elems[0xd] = 0;
          local_128.data._M_elems._56_5_ = 0;
          local_128.data._M_elems[0xf]._1_3_ = 0;
          local_128.exp = 0;
          local_128.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_128,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_178,&local_128,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)(pnVar4->m_backend).data._M_elems + lVar12));
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_88,&local_178);
          lVar11 = lVar11 + 1;
          iVar10 = (*(this->
                     super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SLinSolver[4])(this);
          lVar12 = lVar12 + 0x50;
        } while (lVar11 < iVar10);
      }
    }
    else if (type == 0) {
      pnVar4 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_178.exp = (pnVar4->m_backend).exp;
      local_178.neg = (pnVar4->m_backend).neg;
      fVar3 = (pnVar4->m_backend).fpclass;
      local_178.fpclass = (pnVar4->m_backend).fpclass;
      local_178.prec_elem = (pnVar4->m_backend).prec_elem;
      local_128.fpclass = (pnVar4->m_backend).fpclass;
      local_128.prec_elem = (pnVar4->m_backend).prec_elem;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
      local_128.data._M_elems._32_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
      local_128.data._M_elems._40_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 10);
      local_128.data._M_elems._48_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 0xc);
      uVar5 = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 0xe);
      local_128.data._M_elems._56_5_ = SUB85(uVar5,0);
      local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_128.neg = local_178.neg;
      if ((local_178.neg == true) &&
         (local_128.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
        local_128.neg = false;
      }
      local_178.data._M_elems._0_8_ = *(undefined8 *)(pnVar4->m_backend).data._M_elems;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 2);
      local_178.data._M_elems._16_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 4);
      local_178.data._M_elems._24_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 6);
      local_178.data._M_elems._32_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 8);
      local_178.data._M_elems._40_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 10);
      local_178.data._M_elems._48_8_ = *(undefined8 *)((pnVar4->m_backend).data._M_elems + 0xc);
      local_178.data._M_elems[0xe] = (pnVar4->m_backend).data._M_elems[0xe];
      local_178.data._M_elems[0xf] = (pnVar4->m_backend).data._M_elems[0xf];
      if ((local_178.neg != false) &&
         (fVar3 != cpp_dec_float_finite || local_178.data._M_elems[0] != 0)) {
        local_178.neg = (bool)(local_178.neg ^ 1);
      }
      local_128.exp = local_178.exp;
      iVar10 = (*(this->
                 super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SLinSolver[4])(this);
      if (1 < iVar10) {
        lVar11 = 1;
        lVar12 = 0x98;
        do {
          pnVar4 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iStack_98 = *(int *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + -8);
          bStack_94 = *(bool *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + -4);
          local_90 = *(undefined8 *)((long)(pnVar4->m_backend).data._M_elems + lVar12);
          pauVar1 = (undefined1 (*) [16])((long)(pnVar4->m_backend).data._M_elems + lVar12 + -0x48);
          auVar6 = *pauVar1;
          local_c8 = *(undefined1 (*) [16])
                      ((long)(pnVar4->m_backend).data._M_elems + lVar12 + -0x38);
          local_b8 = *(undefined1 (*) [16])
                      ((long)(pnVar4->m_backend).data._M_elems + lVar12 + -0x28);
          puVar2 = (uint *)((long)(pnVar4->m_backend).data._M_elems + lVar12 + -0x18);
          local_a8._0_8_ = *(undefined8 *)puVar2;
          uVar5 = *(undefined8 *)(puVar2 + 2);
          stack0xffffffffffffff60 = (undefined5)uVar5;
          uStack_9b = (undefined3)((ulong)uVar5 >> 0x28);
          if ((bStack_94 == true) &&
             (local_d8._0_4_ = (undefined4)*(undefined8 *)*pauVar1,
             (fpclass_type)local_90 != cpp_dec_float_finite || local_d8._0_4_ != 0)) {
            bStack_94 = false;
          }
          local_d8 = auVar6;
          if (((fpclass_type)local_90 == cpp_dec_float_NaN) ||
             (local_128.fpclass == cpp_dec_float_NaN)) {
LAB_003dc6fa:
            if ((((fpclass_type)local_90 != cpp_dec_float_NaN) &&
                (local_178.fpclass != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_178),
               auVar9 = local_b8, auVar8 = local_c8, auVar6 = local_d8, 0 < iVar10)) {
              local_178.data._M_elems[0xc] = local_a8[0];
              local_178.data._M_elems[0xd] = local_a8[1];
              local_178.data._M_elems[0xe] = (uint)stack0xffffffffffffff60;
              local_178.data._M_elems[0xf] =
                   (uint)(CONCAT35(uStack_9b,stack0xffffffffffffff60) >> 0x20);
              local_178.data._M_elems[8] = local_b8._0_4_;
              local_178.data._M_elems[9] = local_b8._4_4_;
              local_178.data._M_elems[10] = local_b8._8_4_;
              local_178.data._M_elems[0xb] = local_b8._12_4_;
              local_178.data._M_elems[4] = local_c8._0_4_;
              local_178.data._M_elems[5] = local_c8._4_4_;
              local_178.data._M_elems[6] = local_c8._8_4_;
              local_178.data._M_elems[7] = local_c8._12_4_;
              local_178.data._M_elems[0] = local_d8._0_4_;
              local_178.data._M_elems[1] = local_d8._4_4_;
              local_178.data._M_elems[2] = local_d8._8_4_;
              local_178.data._M_elems[3] = local_d8._12_4_;
              local_178.exp = iStack_98;
              local_178.neg = bStack_94;
              local_178.fpclass = (fpclass_type)local_90;
              local_d8 = auVar6;
              local_c8 = auVar8;
              local_b8 = auVar9;
              pcVar7 = &local_178;
              goto LAB_003dc7dd;
            }
          }
          else {
            iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_128);
            auVar9 = local_b8;
            auVar8 = local_c8;
            auVar6 = local_d8;
            if (-1 < iVar10) goto LAB_003dc6fa;
            local_128.data._M_elems[0xc] = local_a8[0];
            local_128.data._M_elems[0xd] = local_a8[1];
            local_128.data._M_elems._56_5_ = stack0xffffffffffffff60;
            local_128.data._M_elems[0xf]._1_3_ = uStack_9b;
            local_128.data._M_elems[8] = local_b8._0_4_;
            local_128.data._M_elems[9] = local_b8._4_4_;
            local_128.data._M_elems[10] = local_b8._8_4_;
            local_128.data._M_elems[0xb] = local_b8._12_4_;
            local_128.data._M_elems[4] = local_c8._0_4_;
            local_128.data._M_elems[5] = local_c8._4_4_;
            local_128.data._M_elems[6] = local_c8._8_4_;
            local_128.data._M_elems[7] = local_c8._12_4_;
            local_128.data._M_elems[0] = local_d8._0_4_;
            local_128.data._M_elems[1] = local_d8._4_4_;
            local_128.data._M_elems[2] = local_d8._8_4_;
            local_128.data._M_elems[3] = local_d8._12_4_;
            local_128.exp = iStack_98;
            local_128.neg = bStack_94;
            local_128.fpclass = (fpclass_type)local_90;
            local_d8 = auVar6;
            local_c8 = auVar8;
            local_b8 = auVar9;
            pcVar7 = &local_128;
LAB_003dc7dd:
            pcVar7->prec_elem = local_90._4_4_;
          }
          lVar11 = lVar11 + 1;
          iVar10 = (*(this->
                     super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SLinSolver[4])(this);
          lVar12 = lVar12 + 0x50;
        } while (lVar11 < iVar10);
      }
      local_90._0_4_ = cpp_dec_float_finite;
      local_90._4_4_ = 0x10;
      local_d8 = (undefined1  [16])0x0;
      local_c8 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      stack0xffffffffffffff60 = 0;
      uStack_9b = 0;
      iStack_98 = 0;
      bStack_94 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_d8,&local_178,&local_128);
      local_88.data._M_elems[0xc] = local_a8[0];
      local_88.data._M_elems[0xd] = local_a8[1];
      local_88.data._M_elems._56_5_ = stack0xffffffffffffff60;
      local_88.data._M_elems[0xf]._1_3_ = uStack_9b;
      local_88.data._M_elems[8] = local_b8._0_4_;
      local_88.data._M_elems[9] = local_b8._4_4_;
      local_88.data._M_elems[10] = local_b8._8_4_;
      local_88.data._M_elems[0xb] = local_b8._12_4_;
      local_88.data._M_elems[4] = local_c8._0_4_;
      local_88.data._M_elems[5] = local_c8._4_4_;
      local_88.data._M_elems[6] = local_c8._8_4_;
      local_88.data._M_elems[7] = local_c8._12_4_;
      local_88.data._M_elems[0] = local_d8._0_4_;
      local_88.data._M_elems[1] = local_d8._4_4_;
      local_88.data._M_elems[2] = local_d8._8_4_;
      local_88.data._M_elems[3] = local_d8._12_4_;
      local_88.exp = iStack_98;
      local_88.neg = bStack_94;
      local_88.fpclass = (fpclass_type)local_90;
      local_88.prec_elem = local_90._4_4_;
    }
    *(undefined8 *)((local_38->m_backend).data._M_elems + 0xc) = local_88.data._M_elems._48_8_;
    *(ulong *)((local_38->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_88.data._M_elems[0xf]._1_3_,local_88.data._M_elems._56_5_);
    *(undefined8 *)((local_38->m_backend).data._M_elems + 8) = local_88.data._M_elems._32_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 10) = local_88.data._M_elems._40_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_88.data._M_elems._16_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 6) = local_88.data._M_elems._24_8_;
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_88.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_88.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_88.exp;
    (local_38->m_backend).neg = local_88.neg;
    (local_38->m_backend).fpclass = local_88.fpclass;
    (local_38->m_backend).prec_elem = local_88.prec_elem;
  }
  return local_38;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}